

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_append_filter.c
# Opt level: O0

int archive_read_append_filter_program_signature
              (archive *_a,char *cmd,void *signature,size_t signature_len)

{
  int iVar1;
  archive_read_filter *paVar2;
  archive *in_RCX;
  archive_read *in_RDI;
  archive_read *a;
  archive_read_filter *filter;
  archive_read_filter_bidder *bidder;
  int i;
  int number_bidders;
  int r;
  size_t in_stack_ffffffffffffffc0;
  archive_read *a_00;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_4;
  
  iVar1 = archive_read_support_filter_program_signature
                    (in_RCX,(char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     in_stack_ffffffffffffffc0);
  if (iVar1 == 0) {
    iVar1 = 0;
    for (a_00 = (archive_read *)in_RDI->bidders;
        (iVar1 < 0xe &&
        ((*(void **)&a_00->archive == (void *)0x0 ||
         ((a_00->archive).vtable != (archive_vtable_conflict *)0x0))));
        a_00 = (archive_read *)&(a_00->archive).file_count) {
      iVar1 = iVar1 + 1;
    }
    if (*(void **)&a_00->archive == (void *)0x0) {
      archive_set_error(&in_RDI->archive,0x16,"Internal error: Unable to append program filter");
      local_4 = -0x1e;
    }
    else {
      paVar2 = (archive_read_filter *)calloc(1,0xb0);
      if (paVar2 == (archive_read_filter *)0x0) {
        archive_set_error(&in_RDI->archive,0xc,"Out of memory");
        local_4 = -0x1e;
      }
      else {
        paVar2->bidder = (archive_read_filter_bidder *)a_00;
        paVar2->archive = in_RDI;
        paVar2->upstream = in_RDI->filter;
        in_RDI->filter = paVar2;
        iVar1 = (*(code *)(a_00->archive).archive_format_name)(in_RDI->filter);
        if (iVar1 == 0) {
          (a_00->archive).vtable = (archive_vtable_conflict *)in_RDI->filter->name;
          in_RDI->bypass_filter_bidding = 1;
          local_4 = 0;
        }
        else {
          __archive_read_close_filters(a_00);
          __archive_read_free_filters(in_RDI);
          local_4 = -0x1e;
        }
      }
    }
  }
  else {
    local_4 = -0x1e;
  }
  return local_4;
}

Assistant:

int
archive_read_append_filter_program_signature(struct archive *_a,
  const char *cmd, const void *signature, size_t signature_len)
{
  int r, number_bidders, i;
  struct archive_read_filter_bidder *bidder;
  struct archive_read_filter *filter;
  struct archive_read *a = (struct archive_read *)_a;

  if (archive_read_support_filter_program_signature(_a, cmd, signature,
    signature_len) != (ARCHIVE_OK))
    return (ARCHIVE_FATAL);

  number_bidders = sizeof(a->bidders) / sizeof(a->bidders[0]);

  bidder = a->bidders;
  for (i = 0; i < number_bidders; i++, bidder++)
  {
    /* Program bidder name set to filter name after initialization */
    if (bidder->data && !bidder->name)
      break;
  }
  if (!bidder->data)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
        "Internal error: Unable to append program filter");
    return (ARCHIVE_FATAL);
  }

  filter
      = (struct archive_read_filter *)calloc(1, sizeof(*filter));
  if (filter == NULL)
  {
    archive_set_error(&a->archive, ENOMEM, "Out of memory");
    return (ARCHIVE_FATAL);
  }
  filter->bidder = bidder;
  filter->archive = a;
  filter->upstream = a->filter;
  a->filter = filter;
  r = (bidder->init)(a->filter);
  if (r != ARCHIVE_OK) {
    __archive_read_close_filters(a);
    __archive_read_free_filters(a);
    return (ARCHIVE_FATAL);
  }
  bidder->name = a->filter->name;

  a->bypass_filter_bidding = 1;
  return r;
}